

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_resorting(uint N_trials,uint list_size)

{
  ulong _N;
  int iVar1;
  time_t tVar2;
  int *data;
  ostream *poVar3;
  uint k;
  uint uVar4;
  uint i_1;
  uint i;
  ulong uVar5;
  sorted_ptr_arr<int> sorted_data;
  sorted_ptr_arr<int> local_40;
  
  _N = (ulong)list_size;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  data = (int *)operator_new__(_N * 4);
  for (uVar5 = 0; _N != uVar5; uVar5 = uVar5 + 1) {
    iVar1 = rand();
    data[uVar5] = (int)(((double)iVar1 * 100.0) / 2147483647.0);
  }
  sorted_ptr_arr<int>::sorted_ptr_arr(&local_40,data,_N);
  poVar3 = std::operator<<((ostream *)&std::cout,"Sorting nearly-ordered list of ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," integers ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3," times...");
  for (uVar4 = 0; uVar4 != N_trials; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; _N != uVar5; uVar5 = uVar5 + 1) {
      iVar1 = rand();
      data[uVar5] = data[uVar5] + (int)(((double)iVar1 * 3.0) / 2147483647.0);
    }
    sorted_ptr_arr<int>::sort(&local_40);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Done.");
  std::endl<char,std::char_traits<char>>(poVar3);
  operator_delete__(data);
  sorted_ptr_arr<int>::~sorted_ptr_arr(&local_40);
  return;
}

Assistant:

void test_resorting(unsigned int N_trials, unsigned int list_size) {
	srand(time(NULL));
	
	int* test_input = new int[list_size];
	for(unsigned int i=0; i<list_size; i++) { test_input[i] = (int)(100*(double)rand()/(double)RAND_MAX); }
	sorted_ptr_arr<int> sorted_data(&test_input[0], list_size);
	
	std::cout << "Sorting nearly-ordered list of " << list_size << " integers " << N_trials << " times..."; 
	for(unsigned int k=0; k<N_trials; k++) {
		for(unsigned int i=0; i<list_size; i++) { test_input[i] += (int)(3*(double)rand()/(double)RAND_MAX); }
		sorted_data.sort();
	}
	std::cout << "Done." << std::endl;
	
	delete[] test_input;
}